

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyCopyBLASAttribs(IRenderDevice *pDevice,CopyBLASAttribs *Attribs)

{
  undefined *puVar1;
  RAYTRACING_BUILD_AS_FLAGS RVar2;
  int iVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  char (*Args_1) [20];
  long lVar7;
  char (*Args_2) [18];
  undefined8 uVar8;
  char (*in_RCX) [73];
  char *in_stack_fffffffffffffc78;
  char (*in_stack_fffffffffffffc80) [45];
  char (*in_stack_fffffffffffffc90) [34];
  code *pcVar9;
  undefined1 local_2e8 [8];
  string _msg_1;
  string msg_14;
  string msg_13;
  BottomLevelASDesc *DstDesc_1;
  BottomLevelASDesc *SrcDesc_1;
  string msg_12;
  BLASBoundingBoxDesc *DstBox;
  string _msg;
  Uint32 Index_1;
  BLASBoundingBoxDesc *SrcBox;
  char *pcStack_218;
  Uint32 i_1;
  char *local_210;
  undefined1 local_208 [8];
  string msg_11;
  Char *local_1e0;
  undefined1 local_1d8 [8];
  string msg_10;
  string msg_9;
  undefined1 local_190 [8];
  string msg_8;
  Char *local_168;
  undefined1 local_160 [8];
  string msg_7;
  string msg_6;
  BLASTriangleDesc *DstTri;
  string msg_5;
  Uint32 Index;
  BLASTriangleDesc *SrcTri;
  undefined1 local_e0 [4];
  Uint32 i;
  string msg_4;
  string msg_3;
  string msg_2;
  BottomLevelASDesc *DstDesc;
  BottomLevelASDesc *SrcDesc;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  CopyBLASAttribs *Attribs_local;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = Attribs;
  if (Attribs->pSrc == (IBottomLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              ((string *)local_40,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pSrc must not be null.",(char (*) [23])in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [73])0x396;
    DebugAssertionFailed
              (pCVar4,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x396);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (*(long *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[32],char[23]>
              ((string *)&SrcDesc,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pDst must not be null.",(char (*) [23])in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [73])0x397;
    DebugAssertionFailed
              (pCVar4,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x397);
    std::__cxx11::string::~string((string *)&SrcDesc);
  }
  if (*(char *)(msg.field_2._8_8_ + 0x10) == '\0') {
    iVar3 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if (*(int *)CONCAT44(extraout_var,iVar3) == 5) {
      lVar5 = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
      lVar6 = (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x20))();
      if (*(int *)(lVar5 + 0x10) != *(int *)(lVar6 + 0x10)) {
        in_stack_fffffffffffffc78 = ").";
        FormatString<char[32],char[26],unsigned_int,char[49],unsigned_int,char[3]>
                  ((string *)((long)&msg_3.field_2 + 8),
                   (Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS triangle count (",(char (*) [26])(lVar5 + 0x10),
                   (uint *)") must be equal to the dst BLAS triangle count (",
                   (char (*) [49])(lVar6 + 0x10),(uint *)0xf65ced,
                   (char (*) [3])in_stack_fffffffffffffc80);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a1);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      if (*(int *)(lVar5 + 0x20) != *(int *)(lVar6 + 0x20)) {
        in_stack_fffffffffffffc78 = ").";
        FormatString<char[32],char[21],unsigned_int,char[44],unsigned_int,char[3]>
                  ((string *)((long)&msg_4.field_2 + 8),
                   (Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS box count (",(char (*) [21])(lVar5 + 0x20),
                   (uint *)") must be equal to the dst BLAS box count (",
                   (char (*) [44])(lVar6 + 0x20),(uint *)0xf65ced,
                   (char (*) [3])in_stack_fffffffffffffc80);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a4);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      if (*(byte *)(lVar5 + 0x24) != *(byte *)(lVar6 + 0x24)) {
        FormatString<char[32],char[74]>
                  ((string *)local_e0,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])
                   "Source and destination BLASes must have been created with the same flags.",
                   (char (*) [74])(ulong)*(byte *)(lVar6 + 0x24));
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a7);
        std::__cxx11::string::~string((string *)local_e0);
      }
      for (SrcTri._4_4_ = 0; SrcTri._4_4_ < *(uint *)(lVar5 + 0x10); SrcTri._4_4_ = SrcTri._4_4_ + 1
          ) {
        Args_1 = (char (*) [20])(*(long *)(lVar5 + 8) + (ulong)SrcTri._4_4_ * 0x18);
        msg_5.field_2._12_4_ =
             (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x40))
                       (*(long **)(msg.field_2._8_8_ + 8),*(undefined8 *)*Args_1);
        if (msg_5.field_2._12_4_ == -1) {
          in_stack_fffffffffffffc78 = " is not found in pDst.";
          FormatString<char[32],char[20],char_const*,char[13],unsigned_int,char[23]>
                    ((string *)&DstTri,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])"Src GeometryName (\'",Args_1,(char **)"\') at index ",
                     (char (*) [13])((long)&SrcTri + 4),(uint *)0xf4e286,
                     (char (*) [23])in_stack_fffffffffffffc80);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3ae);
          std::__cxx11::string::~string((string *)&DstTri);
        }
        lVar7 = *(long *)(lVar6 + 8) + (ulong)(uint)msg_5.field_2._12_4_ * 0x18;
        if (*(int *)(*Args_1 + 8) != *(int *)(lVar7 + 8)) {
          in_stack_fffffffffffffc80 = (char (*) [45])(lVar7 + 8);
          in_stack_fffffffffffffc78 = " does not match MaxVertexCount value (";
          FormatString<char[32],char[23],unsigned_int,char[43],unsigned_int,char[39],unsigned_int,char[34]>
                    ((string *)((long)&msg_7.field_2 + 8),
                     (Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0xf4e11a,
                     (char (*) [23])(*Args_1 + 8),
                     (uint *)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),
                     (uint *)" does not match MaxVertexCount value (",
                     (char (*) [39])in_stack_fffffffffffffc80,
                     (uint *)") in the destination description.",in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3b3);
          std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
        }
        if ((*Args_1)[0xc] != *(char *)(lVar7 + 0xc)) {
          local_168 = GetValueTypeString((*Args_1)[0xc]);
          msg_8.field_2._8_8_ = GetValueTypeString(*(VALUE_TYPE *)(lVar7 + 0xc));
          in_stack_fffffffffffffc80 = (char (*) [45])((long)&msg_8.field_2 + 8);
          in_stack_fffffffffffffc78 = " does not match VertexValueType value (";
          FormatString<char[32],char[24],char_const*,char[43],unsigned_int,char[40],char_const*,char[30]>
                    ((string *)local_160,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])0xf4e163,(char (*) [24])&local_168,
                     (char **)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),
                     (uint *)" does not match VertexValueType value (",
                     (char (*) [40])in_stack_fffffffffffffc80,
                     (char **)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3b6);
          std::__cxx11::string::~string((string *)local_160);
        }
        if ((*Args_1)[0xd] != *(char *)(lVar7 + 0xd)) {
          msg_9.field_2._12_4_ = ZEXT14((byte)(*Args_1)[0xd]);
          msg_9.field_2._8_4_ = ZEXT14(*(byte *)(lVar7 + 0xd));
          in_stack_fffffffffffffc80 = (char (*) [45])((long)&msg_9.field_2 + 8);
          in_stack_fffffffffffffc78 = " does not match VertexComponentCount value (";
          FormatString<char[32],char[29],unsigned_int,char[43],unsigned_int,char[45],unsigned_int,char[30]>
                    ((string *)local_190,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])0xf4e1a9,(char (*) [29])((long)&msg_9.field_2 + 0xc),
                     (uint *)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),
                     (uint *)" does not match VertexComponentCount value (",
                     in_stack_fffffffffffffc80,(uint *)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3b9);
          std::__cxx11::string::~string((string *)local_190);
        }
        if (*(int *)(*Args_1 + 0x10) != *(int *)(lVar7 + 0x10)) {
          in_stack_fffffffffffffc80 = (char (*) [45])(lVar7 + 0x10);
          in_stack_fffffffffffffc78 = " does not match MaxPrimitiveCount value (";
          FormatString<char[32],char[26],unsigned_int,char[43],unsigned_int,char[42],unsigned_int,char[30]>
                    ((string *)((long)&msg_10.field_2 + 8),
                     (Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0xf4e1d6,
                     (char (*) [26])(*Args_1 + 0x10),
                     (uint *)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),
                     (uint *)" does not match MaxPrimitiveCount value (",
                     (char (*) [42])in_stack_fffffffffffffc80,
                     (uint *)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3bc);
          std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
        }
        if (Args_1[1][0] != *(char *)(lVar7 + 0x14)) {
          local_1e0 = GetValueTypeString(Args_1[1][0]);
          msg_11.field_2._8_8_ = GetValueTypeString(*(VALUE_TYPE *)(lVar7 + 0x14));
          in_stack_fffffffffffffc80 = (char (*) [45])((long)&msg_11.field_2 + 8);
          in_stack_fffffffffffffc78 = " does not match IndexType value (";
          FormatString<char[32],char[18],char_const*,char[43],unsigned_int,char[34],char_const*,char[30]>
                    ((string *)local_1d8,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])0xf4e200,(char (*) [18])&local_1e0,
                     (char **)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),(uint *)" does not match IndexType value (",
                     (char (*) [34])in_stack_fffffffffffffc80,
                     (char **)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3bf);
          std::__cxx11::string::~string((string *)local_1d8);
        }
        if ((Args_1[1][1] & 1U) != (*(byte *)(lVar7 + 0x15) & 1)) {
          pcStack_218 = "false";
          local_210 = "false";
          if ((Args_1[1][1] & 1U) != 0) {
            local_210 = "true";
          }
          if ((*(byte *)(lVar7 + 0x15) & 1) != 0) {
            pcStack_218 = "true";
          }
          in_stack_fffffffffffffc80 = (char (*) [45])&stack0xfffffffffffffde8;
          in_stack_fffffffffffffc78 = " does not match AllowsTransforms value (";
          FormatString<char[32],char[25],char_const*,char[43],unsigned_int,char[41],char_const*,char[30]>
                    ((string *)local_208,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])0xf4e222,(char (*) [25])&local_210,
                     (char **)") in source triangle description at index ",
                     (char (*) [43])((long)&SrcTri + 4),
                     (uint *)" does not match AllowsTransforms value (",
                     (char (*) [41])in_stack_fffffffffffffc80,
                     (char **)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3c2);
          std::__cxx11::string::~string((string *)local_208);
        }
      }
      for (SrcBox._4_4_ = 0; SrcBox._4_4_ < *(uint *)(lVar5 + 0x20); SrcBox._4_4_ = SrcBox._4_4_ + 1
          ) {
        Args_2 = (char (*) [18])(*(long *)(lVar5 + 0x18) + (ulong)SrcBox._4_4_ * 0x10);
        _msg.field_2._12_4_ =
             (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x40))
                       (*(long **)(msg.field_2._8_8_ + 8),*(undefined8 *)*Args_2);
        if (_msg.field_2._12_4_ == 0xffffffff) {
          FormatString<char[55],unsigned_int,char[18],char_const*,char[25]>
                    ((string *)&DstBox,
                     (Diligent *)"Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[",
                     (char (*) [55])((long)&SrcBox + 4),(uint *)"].GeometryName (\'",Args_2,
                     (char **)"\') is not found in pDst.",(char (*) [25])in_stack_fffffffffffffc78);
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar8 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(2,uVar8,0);
          }
          std::__cxx11::string::~string((string *)&DstBox);
          return false;
        }
        msg_12.field_2._8_8_ = *(long *)(lVar6 + 0x18) + (ulong)(uint)_msg.field_2._12_4_ * 0x10;
        if (*(int *)(*Args_2 + 8) != *(int *)(msg_12.field_2._8_8_ + 8)) {
          in_stack_fffffffffffffc78 = " does not match MaxBoxCount value (";
          FormatString<char[32],char[20],unsigned_int,char[38],unsigned_int,char[36],unsigned_int,char[30]>
                    ((string *)&SrcDesc_1,(Diligent *)"Copy BLAS attribs are invalid: ",
                     (char (*) [32])0xf4e2d3,(char (*) [20])(*Args_2 + 8),
                     (uint *)") in source box description at index ",
                     (char (*) [38])((long)&SrcBox + 4),
                     (uint *)" does not match MaxBoxCount value (",
                     (char (*) [36])(msg_12.field_2._8_8_ + 8),
                     (uint *)") in destination description.",
                     (char (*) [30])in_stack_fffffffffffffc90);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"VerifyCopyBLASAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x3d2);
          std::__cxx11::string::~string((string *)&SrcDesc_1);
        }
      }
    }
  }
  else {
    if (*(char *)(msg.field_2._8_8_ + 0x10) != '\x01') {
      FormatString<char[40]>
                ((string *)local_2e8,(char (*) [40])"IDeviceContext::CopyBLAS: unknown Mode.");
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar9 = (code *)DebugMessageCallback;
        uVar8 = std::__cxx11::string::c_str();
        (*pcVar9)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_2e8);
      return false;
    }
    lVar5 = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
    lVar6 = (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x20))();
    RVar2 = operator&(*(RAYTRACING_BUILD_AS_FLAGS *)(lVar5 + 0x24),
                      RAYTRACING_BUILD_AS_ALLOW_COMPACTION);
    if (RVar2 != RAYTRACING_BUILD_AS_ALLOW_COMPACTION) {
      FormatString<char[32],char[73]>
                ((string *)((long)&msg_14.field_2 + 8),(Diligent *)"Copy BLAS attribs are invalid: "
                 ,(char (*) [32])
                  "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX)
      ;
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [73])0x3db;
      DebugAssertionFailed
                (pCVar4,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3db);
      std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
    }
    if (*(long *)(lVar6 + 0x28) == 0) {
      FormatString<char[32],char[56]>
                ((string *)((long)&_msg_1.field_2 + 8),(Diligent *)"Copy BLAS attribs are invalid: "
                 ,(char (*) [32])"pDst must have been create with non-zero CompactedSize.",
                 (char (*) [56])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3dc);
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
    }
  }
  return true;
}

Assistant:

bool VerifyCopyBLASAttribs(const IRenderDevice* pDevice, const CopyBLASAttribs& Attribs)
{
#define CHECK_COPY_BLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Copy BLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_COPY_BLAS_ATTRIBS(Attribs.pSrc != nullptr, "pSrc must not be null.");
    CHECK_COPY_BLAS_ATTRIBS(Attribs.pDst != nullptr, "pDst must not be null.");

    if (Attribs.Mode == COPY_AS_MODE_CLONE)
    {
        if (pDevice->GetDeviceInfo().Type == RENDER_DEVICE_TYPE_VULKAN)
        {
            const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
            const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.TriangleCount == DstDesc.TriangleCount,
                                    "Src BLAS triangle count (", SrcDesc.TriangleCount, ") must be equal to the dst BLAS triangle count (", DstDesc.TriangleCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.BoxCount == DstDesc.BoxCount,
                                    "Src BLAS box count (", SrcDesc.BoxCount, ") must be equal to the dst BLAS box count (", DstDesc.BoxCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.Flags == DstDesc.Flags,
                                    "Source and destination BLASes must have been created with the same flags.");

            for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            {
                const BLASTriangleDesc& SrcTri = SrcDesc.pTriangles[i];
                const Uint32            Index  = Attribs.pDst->GetGeometryDescIndex(SrcTri.GeometryName);
                CHECK_COPY_BLAS_ATTRIBS(Index != INVALID_INDEX,
                                        "Src GeometryName ('", SrcTri.GeometryName, "') at index ", i, " is not found in pDst.");
                const BLASTriangleDesc& DstTri = DstDesc.pTriangles[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxVertexCount == DstTri.MaxVertexCount,
                                        "MaxVertexCount value (", SrcTri.MaxVertexCount, ") in source triangle description at index ", i,
                                        " does not match MaxVertexCount value (", DstTri.MaxVertexCount, ") in the destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexValueType == DstTri.VertexValueType,
                                        "VertexValueType value (", GetValueTypeString(SrcTri.VertexValueType), ") in source triangle description at index ", i,
                                        " does not match VertexValueType value (", GetValueTypeString(DstTri.VertexValueType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexComponentCount == DstTri.VertexComponentCount,
                                        "VertexComponentCount value (", Uint32{SrcTri.VertexComponentCount}, ") in source triangle description at index ", i,
                                        " does not match VertexComponentCount value (", Uint32{DstTri.VertexComponentCount}, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxPrimitiveCount == DstTri.MaxPrimitiveCount,
                                        "MaxPrimitiveCount value (", SrcTri.MaxPrimitiveCount, ") in source triangle description at index ", i,
                                        " does not match MaxPrimitiveCount value (", DstTri.MaxPrimitiveCount, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.IndexType == DstTri.IndexType,
                                        "IndexType value (", GetValueTypeString(SrcTri.IndexType), ") in source triangle description at index ", i,
                                        " does not match IndexType value (", GetValueTypeString(DstTri.IndexType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.AllowsTransforms == DstTri.AllowsTransforms,
                                        "AllowsTransforms value (", (SrcTri.AllowsTransforms ? "true" : "false"), ") in source triangle description at index ", i,
                                        " does not match AllowsTransforms value (", (DstTri.AllowsTransforms ? "true" : "false"), ") in destination description.");
            }

            for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            {
                const BLASBoundingBoxDesc& SrcBox = SrcDesc.pBoxes[i];
                const Uint32               Index  = Attribs.pDst->GetGeometryDescIndex(SrcBox.GeometryName);
                if (Index == INVALID_INDEX)
                {
                    LOG_ERROR_MESSAGE("Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[", i, "].GeometryName ('", SrcBox.GeometryName, "') is not found in pDst.");
                    return false;
                }
                const BLASBoundingBoxDesc& DstBox = DstDesc.pBoxes[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcBox.MaxBoxCount == DstBox.MaxBoxCount,
                                        "MaxBoxCount value (", SrcBox.MaxBoxCount, ") in source box description at index ", i,
                                        " does not match MaxBoxCount value (", DstBox.MaxBoxCount, ") in destination description.");
            }
        }
    }
    else if (Attribs.Mode == COPY_AS_MODE_COMPACT)
    {
        const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_BLAS_ATTRIBS((SrcDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION, "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");
        CHECK_COPY_BLAS_ATTRIBS(DstDesc.CompactedSize != 0, "pDst must have been create with non-zero CompactedSize.");
    }
    else
    {
        LOG_ERROR_MESSAGE("IDeviceContext::CopyBLAS: unknown Mode.");
        return false;
    }

#undef CHECK_COPY_BLAS_ATTRIBS

    return true;
}